

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
           *this,triplet<unsigned_char> x,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int32_t error_value;
  int iVar6;
  int32_t error_value_00;
  int32_t error_value_01;
  uint uVar7;
  uint uVar8;
  int iVar9;
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this_00;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar2 = (uint)rb.field_2.v3;
  this_00 = &this->traits_;
  uVar7 = (uint3)rb & 0xff;
  uVar10 = -(uint)(uVar7 < ((uint3)ra & 0xff)) | 1;
  iVar9 = (((uint3)x & 0xff) - uVar7) * uVar10;
  iVar1 = (this->traits_).near_lossless;
  iVar6 = -iVar1;
  if (0 < iVar9) {
    iVar6 = iVar1;
  }
  error_value = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::modulo_range
                          (this_00,(iVar6 + iVar9) / (iVar1 * 2 + 1));
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  uVar12 = rb._1_2_ & 0xff;
  uVar11 = -(uint)(uVar12 < (ra._1_2_ & 0xff)) | 1;
  iVar9 = ((x._1_2_ & 0xff) - uVar12) * uVar11;
  iVar1 = (this->traits_).near_lossless;
  iVar6 = -iVar1;
  if (0 < iVar9) {
    iVar6 = iVar1;
  }
  error_value_00 =
       default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::modulo_range
                 (this_00,(iVar6 + iVar9) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  uVar8 = -(uint)(uVar2 < (uint3)ra >> 0x10) | 1;
  iVar9 = (((uint3)x >> 0x10) - uVar2) * uVar8;
  iVar1 = (this->traits_).near_lossless;
  iVar6 = -iVar1;
  if (0 < iVar9) {
    iVar6 = iVar1;
  }
  error_value_01 =
       default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::modulo_range
                 (this_00,(iVar6 + iVar9) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  bVar3 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar10 * error_value + uVar7)
  ;
  bVar4 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar11 * error_value_00 +
                             uVar12);
  bVar5 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar8 * error_value_01 +
                             uVar2);
  return (triplet<unsigned_char>)((uint3)bVar3 | (uint3)bVar4 << 8 | (uint3)bVar5 << 0x10);
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }